

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrWorldMeshBlockML *value
                         )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  NextChainResult NVar6;
  pointer pcVar7;
  long lVar8;
  XrResult XVar9;
  string out;
  string local_370;
  string error_message;
  ios_base local_2e0 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_188;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_170;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_158;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_140;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_128;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_110;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_80;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar9 = XR_SUCCESS;
  if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrWorldMeshBlockML",value->type,
               "VUID-XrWorldMeshBlockML-type-type",XR_TYPE_WORLD_MESH_BLOCK_ML,
               "XR_TYPE_WORLD_MESH_BLOCK_ML");
    XVar9 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    NVar6 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar6 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
      paVar1 = &out.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrWorldMeshBlockML-next-unique","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_98,objects_info);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_370,
                 "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct"
                 ,"");
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_98
                          ,&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if (local_98.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_0020c4f1:
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
LAB_0020c4fe:
      XVar9 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar6 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrWorldMeshBlockML-next-next","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_80,objects_info);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,
                 "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"","")
      ;
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_80,&out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if (local_80.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_0020c4f1;
      goto LAB_0020c4fe;
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!check_members || XVar9 != XR_SUCCESS) {
    return XVar9;
  }
  paVar1 = &error_message.field_2;
  error_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&error_message,"XrWorldMeshBlockML","");
  paVar2 = &out.field_2;
  out._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"blockResult","");
  bVar4 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                         value->blockResult);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out._M_dataplus._M_p != paVar2) {
    operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p != paVar1) {
    operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    error_message._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"XrWorldMeshBlockML","");
    out._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"lod","");
    bVar4 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,value->lod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != paVar1) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    if (bVar4) {
      XVar9 = XR_SUCCESS;
      cVar5 = (value->flags < 0x40) + '\x01';
      if (value->flags == 0) {
        cVar5 = '\0';
      }
      if (cVar5 == '\x02') {
        if ((value->indexCount == 0) && (value->indexBuffer != (uint16_t *)0x0)) {
          error_message._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,"VUID-XrWorldMeshBlockML-indexCount-arraylength","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_110,objects_info);
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,
                     "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0"
                     ,"");
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_110,&out);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          if (local_110.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_110.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)error_message._M_dataplus._M_p != paVar1) {
            operator_delete(error_message._M_dataplus._M_p,
                            error_message.field_2._M_allocated_capacity + 1);
          }
          XVar9 = XR_ERROR_VALIDATION_FAILURE;
        }
        if ((value->indexBuffer == (uint16_t *)0x0) && (value->indexCount != 0)) {
          error_message._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&error_message,"VUID-XrWorldMeshBlockML-indexBuffer-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_128,objects_info);
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,
                     "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not optional since \"indexCount\" is set and must be non-NULL"
                     ,"");
          CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_128,&out);
          local_1b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_128.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_128.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            local_1b8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_128.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1b8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_128.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          if ((value->vertexCount == 0) && (value->vertexBuffer != (XrVector3f *)0x0)) {
            error_message._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,"VUID-XrWorldMeshBlockML-vertexCount-arraylength",""
                      );
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_140,objects_info);
            out._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&out,
                       "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0"
                       ,"");
            CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_140,&out);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != paVar2) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
            }
            if (local_140.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_140.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_140.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_140.
                                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error_message._M_dataplus._M_p != paVar1) {
              operator_delete(error_message._M_dataplus._M_p,
                              error_message.field_2._M_allocated_capacity + 1);
            }
            XVar9 = XR_ERROR_VALIDATION_FAILURE;
          }
          if ((value->vertexBuffer == (XrVector3f *)0x0) && (value->vertexCount != 0)) {
            error_message._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&error_message,"VUID-XrWorldMeshBlockML-vertexBuffer-parameter","")
            ;
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_158,objects_info);
            out._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&out,
                       "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not optional since \"vertexCount\" is set and must be non-NULL"
                       ,"");
            CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_158,&out);
            local_1b8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_158.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1b8.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_158.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)out._M_dataplus._M_p != paVar2) {
              operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              local_1b8.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_158.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1b8.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_158.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            }
          }
          else {
            if ((value->normalCount == 0) && (value->normalBuffer != (XrVector3f *)0x0)) {
              error_message._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,"VUID-XrWorldMeshBlockML-normalCount-arraylength",
                         "");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_170,objects_info);
              out._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,
                         "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0"
                         ,"");
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_170,&out);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != paVar2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
              if (local_170.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error_message._M_dataplus._M_p != paVar1) {
                operator_delete(error_message._M_dataplus._M_p,
                                error_message.field_2._M_allocated_capacity + 1);
              }
              XVar9 = XR_ERROR_VALIDATION_FAILURE;
            }
            if ((value->normalBuffer == (XrVector3f *)0x0) && (value->normalCount != 0)) {
              error_message._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,"VUID-XrWorldMeshBlockML-normalBuffer-parameter",
                         "");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_188,objects_info);
              out._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,
                         "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not optional since \"normalCount\" is set and must be non-NULL"
                         ,"");
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_188,&out);
              local_1b8.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_188.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1b8.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_188.
                   super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != paVar2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                local_1b8.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_188.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_1b8.
                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_188.
                     super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
            }
            else {
              if ((value->confidenceCount == 0) && (value->confidenceBuffer != (float *)0x0)) {
                error_message._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&error_message,
                           "VUID-XrWorldMeshBlockML-confidenceCount-arraylength","");
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_1a0,objects_info);
                out._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&out,
                           "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0"
                           ,"");
                CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    command_name,&local_1a0,&out);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)out._M_dataplus._M_p != paVar2) {
                  operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
                }
                if (local_1a0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1a0.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1a0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1a0.
                                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)error_message._M_dataplus._M_p != paVar1) {
                  operator_delete(error_message._M_dataplus._M_p,
                                  error_message.field_2._M_allocated_capacity + 1);
                }
                XVar9 = XR_ERROR_VALIDATION_FAILURE;
              }
              if (value->confidenceBuffer != (float *)0x0) {
                return XVar9;
              }
              if (value->confidenceCount == 0) {
                return XVar9;
              }
              error_message._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&error_message,
                         "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_1b8,objects_info);
              out._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&out,
                         "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not optional since \"confidenceCount\" is set and must be non-NULL"
                         ,"");
              CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                  command_name,&local_1b8,&out);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)out._M_dataplus._M_p != paVar2) {
                operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
      }
      else {
        if (cVar5 != '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&error_message,
                     "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value "
                     ,0x50);
          local_370._M_dataplus._M_p._0_4_ = (int)value->flags;
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct((ulong)&out,'\n');
          *out._M_dataplus._M_p = '0';
          out._M_dataplus._M_p[1] = 'x';
          pcVar7 = out._M_dataplus._M_p + (out._M_string_length - 1);
          lVar8 = 0;
          do {
            bVar3 = *(byte *)((long)&local_370._M_dataplus._M_p + lVar8);
            *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
            pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
            lVar8 = lVar8 + 1;
            pcVar7 = pcVar7 + -2;
          } while (lVar8 != 4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&error_message," contains illegal bit",0x15);
          out._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,"VUID-XrWorldMeshBlockML-flags-parameter","");
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_f8,objects_info);
          std::__cxx11::stringbuf::str();
          CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                              &local_f8,&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if (local_f8.
              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.
                                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != paVar2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0020d0f1;
        }
        error_message._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,"VUID-XrWorldMeshBlockML-flags-requiredbitmask","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_e0,objects_info);
        out._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero","");
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_e0,&out);
        local_1b8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_e0.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e0.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar2) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          local_1b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_e0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_e0.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      if (local_1b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p == paVar1) {
        return XR_ERROR_VALIDATION_FAILURE;
      }
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
      return XR_ERROR_VALIDATION_FAILURE;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value ",
               0x4e);
    local_370._M_dataplus._M_p._0_4_ = value->lod;
    out._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar7 = out._M_dataplus._M_p + (out._M_string_length - 1);
    lVar8 = 0;
    do {
      bVar3 = *(byte *)((long)&local_370._M_dataplus._M_p + lVar8);
      *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
      pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
      lVar8 = lVar8 + 1;
      pcVar7 = pcVar7 + -2;
    } while (lVar8 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrWorldMeshBlockML-lod-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_c8,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_c8,
                        &local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,
               "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value "
               ,0x56);
    local_370._M_dataplus._M_p._0_4_ = value->blockResult;
    out._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&out,'\n');
    *out._M_dataplus._M_p = '0';
    out._M_dataplus._M_p[1] = 'x';
    pcVar7 = out._M_dataplus._M_p + (out._M_string_length - 1);
    lVar8 = 0;
    do {
      bVar3 = *(byte *)((long)&local_370._M_dataplus._M_p + lVar8);
      *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
      pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
      lVar8 = lVar8 + 1;
      pcVar7 = pcVar7 + -2;
    } while (lVar8 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrWorldMeshBlockML-blockResult-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b0,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_b0,
                        &local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0020d0f1:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  std::ios_base::~ios_base(local_2e0);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrWorldMeshBlockML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_WORLD_MESH_BLOCK_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrWorldMeshBlockML",
                             value->type, "VUID-XrWorldMeshBlockML-type-type", XR_TYPE_WORLD_MESH_BLOCK_ML, "XR_TYPE_WORLD_MESH_BLOCK_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrWorldMeshBlockML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrWorldMeshBlockML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBlockML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrWorldMeshBlockResultML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "blockResult", objects_info, value->blockResult)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshBlockResultML \"blockResult\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->blockResult));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-blockResult-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrWorldMeshDetectorLodML value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrWorldMeshBlockML", "lod", objects_info, value->lod)) {
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML contains invalid XrWorldMeshDetectorLodML \"lod\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->lod));
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-lod-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    ValidateXrFlagsResult world_mesh_detector_flags_ml_result = ValidateXrWorldMeshDetectorFlagsML(value->flags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == world_mesh_detector_flags_ml_result) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrWorldMeshDetectorFlagsML \"flags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != world_mesh_detector_flags_ml_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrWorldMeshBlockML invalid member XrWorldMeshDetectorFlagsML \"flags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->flags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-flags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->indexCount && nullptr != value->indexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member indexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->indexBuffer && 0 != value->indexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-indexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for uint16_t \"indexBuffer\" is which not "
                            "optional since \"indexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-indexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->vertexCount && nullptr != value->vertexBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member vertexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->vertexBuffer && 0 != value->vertexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-vertexBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"vertexBuffer\" is which not "
                            "optional since \"vertexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-vertexBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->normalCount && nullptr != value->normalBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member normalCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->normalBuffer && 0 != value->normalCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-normalBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for XrVector3f \"normalBuffer\" is which not "
                            "optional since \"normalCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-normalBuffer-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->confidenceCount && nullptr != value->confidenceBuffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBlockML member confidenceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->confidenceBuffer && 0 != value->confidenceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBlockML contains invalid NULL for float \"confidenceBuffer\" is which not "
                            "optional since \"confidenceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrWorldMeshBlockML-confidenceBuffer-parameter" type
    // Everything checked out properly
    return xr_result;
}